

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris.c
# Opt level: O1

GList * get_playing_players(void)

{
  gpointer *ppvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  GList *pGVar7;
  MediaPlayer2Player *object;
  gchar *pgVar8;
  GList *pGVar9;
  GError *error;
  gchar *name;
  GVariantIter *iter;
  
  error = (GError *)0x0;
  lVar4 = 0;
  lVar3 = g_bus_get_sync(2,0,&error);
  if (lVar3 != 0) {
    lVar4 = g_dbus_proxy_new_sync
                      (lVar3,4,0,"org.freedesktop.DBus","/org/freedesktop/DBus",
                       "org.freedesktop.DBus",0,&error);
    g_object_unref(lVar3);
  }
  if (lVar4 == 0) {
    pGVar7 = (GList *)0x0;
    g_log(0,8,"%s",error->message);
    g_error_free(error);
    pGVar9 = pGVar7;
  }
  else {
    uVar5 = g_variant_new("()");
    lVar3 = g_dbus_proxy_call_sync(lVar4,"ListNames",uVar5,0,0xffffffff,0,&error);
    if (lVar3 == 0) {
      pGVar7 = (GList *)0x0;
      g_log(0,8,"%s",error->message);
      g_error_free(error);
      g_object_unref(lVar4);
      pGVar9 = pGVar7;
    }
    else {
      uVar5 = 0;
      g_variant_get(lVar3,"(as)",&iter);
      iVar2 = g_variant_iter_loop(iter,"s",&name);
      if (iVar2 != 0) {
        uVar5 = 0;
        do {
          pgVar8 = name;
          iVar2 = strncmp(name,"org.mpris.MediaPlayer2",0x16);
          if (iVar2 == 0) {
            pcVar6 = strdup(pgVar8);
            uVar5 = g_list_prepend(uVar5,pcVar6);
          }
          iVar2 = g_variant_iter_loop(iter,"s",&name);
        } while (iVar2 != 0);
      }
      pGVar7 = (GList *)g_list_reverse(uVar5);
      pGVar9 = pGVar7;
    }
  }
joined_r0x0010e927:
  if (pGVar7 == (GList *)0x0) {
    return pGVar9;
  }
  ppvVar1 = &pGVar7->data;
  pGVar7 = pGVar7->next;
  object = get_player_by_name((gchar *)*ppvVar1,(GError **)0x0);
  if (object != (MediaPlayer2Player *)0x0) goto code_r0x0010e946;
  g_object_unref(0);
  goto LAB_0010e973;
code_r0x0010e946:
  pgVar8 = media_player2_player_get_playback_status(object);
  iVar2 = strcmp(pgVar8,"Playing");
  g_object_unref(object);
  if (iVar2 != 0) {
LAB_0010e973:
    pGVar9 = (GList *)g_list_delete_link(pGVar9);
  }
  goto joined_r0x0010e927;
}

Assistant:

GList*
get_playing_players()
{
  GList* players = get_all_players();
  GList* elem = players;
  while (elem != NULL) {
    GList* next = elem->next;
    if (!is_player_playing(elem->data)) {
      players = g_list_delete_link(players, elem);
    }
    elem = next;
  }
  return players;
}